

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execTst<(moira::Instr)127,(moira::Mode)8,(moira::Size)1>(Moira *this,u16 opcode)

{
  u32 uVar1;
  
  uVar1 = computeEA<(moira::Mode)8,(moira::Size)1,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,uVar1);
  (this->reg).sr.n = (bool)((byte)uVar1 >> 7);
  (this->reg).sr.z = (byte)uVar1 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  return;
}

Assistant:

void
Moira::execTst(u16 opcode)
{
    int rg = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(rg, ea, data)) return;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch<POLLIPL>();
}